

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::RunCMake
          (cmCTestBuildAndTestHandler *this,string *outstring,ostringstream *out,
          string *cmakeOutString,cmake *cm)

{
  char *__s;
  value_type *pvVar1;
  cmCTest *pcVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  long lVar6;
  ostream *poVar7;
  string *opt;
  value_type *__x;
  allocator<char> local_1f1;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = outstring;
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,psVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,&this->SourceDir);
  psVar4 = &this->BuildGenerator;
  if ((this->BuildGenerator)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"-G",psVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->BuildGeneratorPlatform)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"-A",&this->BuildGeneratorPlatform);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->BuildGeneratorToolset)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"-T",&this->BuildGeneratorToolset);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if (psVar5->_M_string_length != 0) {
    psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    __s = (psVar5->_M_dataplus)._M_p;
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,__s,&local_1f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,"-DCMAKE_BUILD_TYPE:STRING=",&local_1e8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
  }
  if ((this->BuildMakeProgram)._M_string_length != 0) {
    lVar6 = std::__cxx11::string::find((char *)psVar4,0x6139ee);
    if (lVar6 == -1) {
      lVar6 = std::__cxx11::string::find((char *)psVar4,0x5fef58);
      if (lVar6 == -1) goto LAB_0018005f;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"-DCMAKE_MAKE_PROGRAM:FILEPATH=",&this->BuildMakeProgram);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCTestLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
LAB_0018005f:
  pvVar1 = (this->BuildOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->BuildOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,__x);
  }
  iVar3 = cmake::Run(cm,&args);
  if (iVar3 == 0) {
    if (this->BuildTwoConfig == true) {
      iVar3 = cmake::Run(cm,&args);
      if (iVar3 != 0) {
        std::operator<<((ostream *)out,"Error: cmake execution failed\n");
        poVar7 = std::operator<<((ostream *)out,(string *)cmakeOutString);
        std::operator<<(poVar7,"\n");
        if (local_1f0 == (string *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::__cxx11::stringbuf::str();
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&local_1e8);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string((string *)&local_1e8);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                       ,0x6f,local_1e8._M_dataplus._M_p,false);
          goto LAB_00180205;
        }
        std::__cxx11::stringbuf::str();
        goto LAB_001800e1;
      }
    }
    std::operator<<((ostream *)out,"======== CMake output     ======\n");
    std::operator<<((ostream *)out,(string *)cmakeOutString);
    iVar3 = 0;
    std::operator<<((ostream *)out,"======== End CMake output ======\n");
  }
  else {
    std::operator<<((ostream *)out,"Error: cmake execution failed\n");
    poVar7 = std::operator<<((ostream *)out,(string *)cmakeOutString);
    std::operator<<(poVar7,"\n");
    if (local_1f0 == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::stringbuf::str();
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&local_1e8);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&local_1e8);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,99,local_1e8._M_dataplus._M_p,false);
LAB_00180205:
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_001800e1:
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    iVar3 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar3;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMake(std::string* outstring,
                                         std::ostringstream& out,
                                         std::string& cmakeOutString,
                                         cmake* cm)
{
  std::vector<std::string> args;
  args.push_back(cmSystemTools::GetCMakeCommand());
  args.push_back(this->SourceDir);
  if (!this->BuildGenerator.empty()) {
    args.push_back("-G" + this->BuildGenerator);
  }
  if (!this->BuildGeneratorPlatform.empty()) {
    args.push_back("-A" + this->BuildGeneratorPlatform);
  }
  if (!this->BuildGeneratorToolset.empty()) {
    args.push_back("-T" + this->BuildGeneratorToolset);
  }

  const char* config = nullptr;
  if (!this->CTest->GetConfigType().empty()) {
    config = this->CTest->GetConfigType().c_str();
  }
#ifdef CMAKE_INTDIR
  if (!config) {
    config = CMAKE_INTDIR;
  }
#endif

  if (config) {
    args.push_back("-DCMAKE_BUILD_TYPE:STRING=" + std::string(config));
  }
  if (!this->BuildMakeProgram.empty() &&
      (this->BuildGenerator.find("Make") != std::string::npos ||
       this->BuildGenerator.find("Ninja") != std::string::npos)) {
    args.push_back("-DCMAKE_MAKE_PROGRAM:FILEPATH=" + this->BuildMakeProgram);
  }

  for (std::string const& opt : this->BuildOptions) {
    args.push_back(opt);
  }
  if (cm->Run(args) != 0) {
    out << "Error: cmake execution failed\n";
    out << cmakeOutString << "\n";
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
    }
    return 1;
  }
  // do another config?
  if (this->BuildTwoConfig) {
    if (cm->Run(args) != 0) {
      out << "Error: cmake execution failed\n";
      out << cmakeOutString << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
      }
      return 1;
    }
  }
  out << "======== CMake output     ======\n";
  out << cmakeOutString;
  out << "======== End CMake output ======\n";
  return 0;
}